

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O1

Byte * __thiscall
CharStringType2Interpreter::InterpretIfelse
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  size_t *psVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  int iVar8;
  Trace *this_00;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  CharStringOperand valueB;
  CharStringOperand valueA;
  _List_node_base *local_68;
  _List_node_base *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar8 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x27])
                    (this->mImplementationHelper,this);
  if (iVar8 != 0) {
    return (Byte *)0x0;
  }
  uVar2 = (this->mOperandStack).
          super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
          _M_size;
  if (uVar2 < 4) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting"
                      ,(this->mOperandStack).
                       super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                       _M_impl._M_node._M_size);
    return (Byte *)0x0;
  }
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  p_Var9 = p_Var10[1]._M_next;
  local_68 = p_Var10[1]._M_prev;
  (this->mOperandStack).super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
  _M_impl._M_node._M_size = uVar2 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  p_Var7 = p_Var10[1]._M_next;
  local_60 = p_Var10[1]._M_prev;
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  p_Var3 = p_Var10[1]._M_next;
  p_Var4 = p_Var10[1]._M_prev;
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  p_Var5 = p_Var10[1]._M_next;
  p_Var6 = p_Var10[1]._M_prev;
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  if ((((ulong)p_Var7 & 1) == 0) || (((ulong)p_Var9 & 1) == 0)) {
    if (((ulong)p_Var7 & 1) != 0) {
      local_60 = (_List_node_base *)(double)(long)local_60;
    }
    if (((ulong)p_Var9 & 1) != 0) {
      local_68 = (_List_node_base *)(double)(long)local_68;
    }
    p_Var9 = (_List_node_base *)operator_new(0x20);
    p_Var10 = p_Var9 + 1;
    if ((double)local_68 < (double)local_60) goto LAB_001a4dcc;
  }
  else {
    p_Var9 = (_List_node_base *)operator_new(0x20);
    p_Var10 = p_Var9 + 1;
    if ((long)local_68 < (long)local_60) {
LAB_001a4dcc:
      local_58 = SUB84(p_Var3,0);
      uStack_54 = (undefined4)((ulong)p_Var3 >> 0x20);
      uStack_50 = SUB84(p_Var4,0);
      uStack_4c = (undefined4)((ulong)p_Var4 >> 0x20);
      local_48 = local_58;
      uStack_44 = uStack_54;
      uStack_40 = uStack_50;
      uStack_3c = uStack_4c;
      goto LAB_001a4dd1;
    }
  }
  local_48 = SUB84(p_Var5,0);
  uStack_44 = (undefined4)((ulong)p_Var5 >> 0x20);
  uStack_40 = SUB84(p_Var6,0);
  uStack_3c = (undefined4)((ulong)p_Var6 >> 0x20);
LAB_001a4dd1:
  *(undefined4 *)&p_Var10->_M_next = local_48;
  *(undefined4 *)((long)&p_Var10->_M_next + 4) = uStack_44;
  *(undefined4 *)&p_Var10->_M_prev = uStack_40;
  *(undefined4 *)((long)&p_Var10->_M_prev + 4) = uStack_3c;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretIfelse(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Ifelse(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand valueC;
	CharStringOperand valueD;

	if(mOperandStack.size() < 4) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}		

	valueD = mOperandStack.back();
	mOperandStack.pop_back();
	valueC = mOperandStack.back();
	mOperandStack.pop_back();
	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();


	if(!valueC.IsInteger || !valueD.IsInteger)
	{
		if((valueC.IsInteger ? (double)valueC.IntegerValue : valueC.RealValue) >
			(valueD.IsInteger ? (double)valueD.IntegerValue : valueD.RealValue))
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}
	else
	{
		if(valueC.IntegerValue > valueD.IntegerValue)
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}

	return inProgramCounter;
}